

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::runProbing(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  double dVar1;
  HighsPostsolveStack *pHVar2;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  end;
  bool bVar3;
  bool bVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  HighsInt HVar7;
  HighsInt HVar8;
  pointer pHVar9;
  reference pvVar10;
  long *plVar11;
  reference pvVar12;
  int *piVar13;
  iterator mipsolver;
  iterator iVar14;
  vector<int,_std::allocator<int>_> *pvVar15;
  size_type sVar16;
  vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_> *this_00;
  size_type sVar17;
  unsigned_long *puVar18;
  __tuple_element_t<3UL,_tuple<long,_int,_int,_int>_> *p_Var19;
  HighsImplications *this_01;
  int *piVar20;
  long lVar21;
  reference piVar22;
  reference ppVar23;
  reference pvVar24;
  long lVar25;
  HighsDomain *in_RSI;
  long *in_RDI;
  vector<double,_std::allocator<double>_> *pvVar26;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar27;
  HighsDomain *in_stack_00000108;
  HighsMipSolverData *in_stack_00000110;
  Result __result_2;
  Result __result_1;
  Result __result;
  HighsInt i_3;
  double val;
  pair<int,_HighsCliqueTable::CliqueVar> *cliqueextension;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
  *__range2_2;
  HighsInt addednnz;
  vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
  *extensionvars;
  HighsInt delrow;
  iterator __end2_1;
  iterator __begin2_1;
  vector<int,_std::allocator<int>_> *__range2_1;
  HighsInt newNumDel;
  bool probing_result;
  HighsInt numNewCliques;
  HighsInt numBoundChgs;
  HighsInt i_2;
  tuple<long,_int,_int,_int> *binvar;
  iterator __end2;
  iterator __begin2;
  vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  *__range2;
  size_t numLiftOpps;
  size_t maxNumLiftOpps;
  anon_class_8_1_8991fb9c modelHasPercentageContVars;
  HighsInt numFail;
  int64_t splayContingent;
  HighsInt numDel;
  HighsInt numDelStart;
  HighsInt numImplicsStart;
  HighsInt numCliquesStart;
  size_t numChangedCols;
  HighsInt implicsDown;
  HighsInt implicsUp;
  HighsInt i_1;
  HighsRandom random;
  vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
  binaries;
  double tmpLimit;
  bool firstCall;
  HighsImplications *implications;
  HighsCliqueTable *cliquetable;
  HighsDomain *domain;
  HighsInt oldNumProbed;
  double newUb;
  double newLb;
  HighsInt i;
  double hugeBound;
  HighsPostsolveStack *in_stack_000009e8;
  HPresolve *in_stack_000009f0;
  undefined4 in_stack_fffffffffffffc08;
  int iVar28;
  HighsUInt in_stack_fffffffffffffc0c;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  undefined4 in_stack_fffffffffffffc18;
  HighsInt in_stack_fffffffffffffc1c;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  HighsInt in_stack_fffffffffffffc2c;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  size_type in_stack_fffffffffffffc38;
  value_type vVar29;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  value_type in_stack_fffffffffffffc48;
  HPresolve *in_stack_fffffffffffffc50;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc58;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc60;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  HPresolve *in_stack_fffffffffffffc70;
  double in_stack_fffffffffffffc78;
  vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
  *in_stack_fffffffffffffc80;
  HighsInt in_stack_fffffffffffffc88;
  HighsInt in_stack_fffffffffffffc8c;
  HPresolve *in_stack_fffffffffffffc90;
  HPresolve *in_stack_fffffffffffffc98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffca0;
  int *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  HighsInt in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  HighsInt in_stack_fffffffffffffce8;
  HighsInt in_stack_fffffffffffffcec;
  HighsInt in_stack_fffffffffffffd04;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd60;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd68;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd70;
  HPresolve *in_stack_fffffffffffffd78;
  int local_1fc;
  __normal_iterator<std::pair<int,_HighsCliqueTable::CliqueVar>_*,_std::vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>_>
  local_1e0;
  HPresolve *local_1d8;
  int local_1cc;
  HPresolve *local_1c8;
  int local_1bc;
  int *local_1b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1b0;
  vector<int,_std::allocator<int>_> *local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  undefined1 local_18d;
  int local_18c;
  int local_188;
  int local_184 [3];
  int local_178;
  int local_174 [2];
  __tuple_element_t<3UL,_tuple<long,_int,_int,_int>_> local_16c;
  reference local_168;
  tuple<long,_int,_int,_int> *local_160;
  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
  in_stack_fffffffffffffea8;
  unsigned_long local_130 [4];
  int local_10c;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  HighsCliqueTable *in_stack_ffffffffffffff00;
  int local_f8;
  size_type local_e8;
  undefined8 in_stack_ffffffffffffff20;
  undefined1 uVar30;
  HighsMipSolver *in_stack_ffffffffffffff28;
  HighsInt in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_c8;
  int local_c4;
  long local_c0 [2];
  double local_b0;
  HighsInt local_a4;
  int local_a0;
  int local_9c;
  double local_68;
  byte local_59;
  HighsImplications *local_58;
  HighsCliqueTable *local_50;
  HPresolve *local_48;
  int local_3c;
  double local_38;
  HighsPostsolveStack *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar31;
  Result local_4;
  
  HighsMipAnalysis::mipTimerStart
            ((HighsMipAnalysis *)in_stack_fffffffffffffc50,
             (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  *(undefined1 *)(in_RDI + 0xc6) = 0;
  if (*(int *)((long)in_RDI + 0x624) + (int)in_RDI[0xc4] != 0) {
    shrinkProblem(in_stack_000009f0,in_stack_000009e8);
  }
  toCSC(in_stack_fffffffffffffc70,
        (vector<double,_std::allocator<double>_> *)
        CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68),in_stack_fffffffffffffc60,
        in_stack_fffffffffffffc58);
  okFromCSC(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
            in_stack_fffffffffffffd60);
  pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6f80a7);
  HVar5 = numNonzeros((HPresolve *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
  HighsCliqueTable::setMaxEntries(&pHVar9->cliquetable,HVar5);
  dVar27 = (double)in_RDI[4];
  for (iVar31 = 0; uVar30 = (undefined1)((ulong)in_stack_ffffffffffffff20 >> 0x38),
      iVar31 != *(int *)*in_RDI; iVar31 = iVar31 + 1) {
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)iVar31);
    dVar1 = *pvVar10;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),(long)iVar31);
    if (dVar1 < *pvVar10) {
LAB_006f81c9:
      pvVar26 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x32);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar26,(long)iVar31);
      std::abs((int)pvVar26);
      if (extraout_XMM0_Qa <= dVar27 / 1e-14) {
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),(long)iVar31
                            );
        pHVar2 = (HighsPostsolveStack *)*pvVar10;
        in_stack_ffffffffffffffd0 = pHVar2;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),
                             (long)iVar31);
        if (*pvVar10 <= (double)pHVar2 && (double)pHVar2 != *pvVar10) {
          changeColLower((HPresolve *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                         (double)in_stack_fffffffffffffca0);
        }
      }
      pvVar26 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x35);
      std::vector<double,_std::allocator<double>_>::operator[](pvVar26,(long)iVar31);
      std::abs((int)pvVar26);
      if (extraout_XMM0_Qa_00 <= dVar27 / 1e-14) {
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)iVar31
                            );
        dVar1 = *pvVar10;
        local_38 = dVar1;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),
                             (long)iVar31);
        if (dVar1 < *pvVar10) {
          changeColUpper((HPresolve *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                         (double)in_stack_fffffffffffffca0);
        }
      }
    }
    else {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)iVar31)
      ;
      dVar1 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)iVar31);
      if (*pvVar10 < dVar1) goto LAB_006f81c9;
    }
  }
  local_3c = *(int *)((long)in_RDI + 0x61c);
  std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
            ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6f8390);
  HighsMipSolverData::setupDomainPropagation(in_stack_00000110);
  pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6f83b0);
  local_48 = (HPresolve *)&pHVar9->domain;
  HighsDomain::propagate((HighsDomain *)in_stack_fffffffffffffea8._M_current);
  bVar3 = HighsDomain::infeasible((HighsDomain *)local_48);
  if (bVar3) {
    HighsMipAnalysis::mipTimerStop
              ((HighsMipAnalysis *)in_stack_fffffffffffffc50,
               (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
    return kPrimalInfeasible;
  }
  pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6f8423);
  local_50 = &pHVar9->cliquetable;
  pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6f844d);
  local_58 = &pHVar9->implications;
  pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6f8477);
  local_59 = (pHVar9->cliquesExtracted ^ 0xffU) & 1;
  pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6f84a5);
  pHVar9->cliquesExtracted = true;
  if ((local_59 & 1) != 0) {
    HighsCliqueTable::extractCliques
              ((HighsCliqueTable *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28,(bool)uVar30);
    bVar3 = HighsDomain::infeasible((HighsDomain *)local_48);
    if (bVar3) {
      HighsMipAnalysis::mipTimerStop
                ((HighsMipAnalysis *)in_stack_fffffffffffffc50,
                 (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
      return kPrimalInfeasible;
    }
    pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
             operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                        0x6f8530);
    if ((pHVar9->upper_limit != INFINITY) || (NAN(pHVar9->upper_limit))) {
      pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6f8565);
      local_68 = pHVar9->upper_limit;
      dVar27 = local_68 - *(double *)(*in_RDI + 0xf8);
      pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6f85ae);
      pHVar9->upper_limit = dVar27;
      HighsCliqueTable::extractObjCliques
                (in_stack_ffffffffffffff00,
                 (HighsMipSolver *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      dVar27 = local_68;
      pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
               operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                           *)0x6f8605);
      pHVar9->upper_limit = dVar27;
      bVar3 = HighsDomain::infeasible((HighsDomain *)local_48);
      if (bVar3) {
        HighsMipAnalysis::mipTimerStop
                  ((HighsMipAnalysis *)in_stack_fffffffffffffc50,
                   (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
        return kPrimalInfeasible;
      }
    }
    HighsDomain::propagate((HighsDomain *)in_stack_fffffffffffffea8._M_current);
    bVar3 = HighsDomain::infeasible((HighsDomain *)local_48);
    if (bVar3) {
      HighsMipAnalysis::mipTimerStop
                ((HighsMipAnalysis *)in_stack_fffffffffffffc50,
                 (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
      return kPrimalInfeasible;
    }
  }
  HighsCliqueTable::cleanupFixed
            ((HighsCliqueTable *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
             (HighsDomain *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  bVar3 = HighsDomain::infeasible((HighsDomain *)local_48);
  if (bVar3) {
    HighsMipAnalysis::mipTimerStop
              ((HighsMipAnalysis *)in_stack_fffffffffffffc50,
               (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
    return kPrimalInfeasible;
  }
  std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>::
  vector((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
          *)0x6f8709);
  pHVar9 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x6f8721);
  bVar3 = HighsCliqueTable::isFull(&pHVar9->cliquetable);
  if (!bVar3) {
    std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
    ::reserve((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
               *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
              in_stack_fffffffffffffc38);
    HighsRandom::HighsRandom
              ((HighsRandom *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
               in_stack_fffffffffffffc0c);
    for (local_9c = 0; local_9c != *(int *)*in_RDI; local_9c = local_9c + 1) {
      bVar3 = HighsDomain::isBinary
                        ((HighsDomain *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         in_stack_fffffffffffffc0c);
      if (bVar3) {
        local_a0 = HighsCliqueTable::getNumImplications
                             ((HighsCliqueTable *)
                              CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                              in_stack_fffffffffffffc2c,
                              SUB41((uint)in_stack_fffffffffffffc28 >> 0x18,0));
        local_a4 = HighsCliqueTable::getNumImplications
                             ((HighsCliqueTable *)
                              CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                              in_stack_fffffffffffffc2c,
                              SUB41((uint)in_stack_fffffffffffffc28 >> 0x18,0));
        local_c0[1] = 5000;
        local_c0[0] = (long)local_a0 * (long)local_a4;
        plVar11 = std::min<long>(local_c0 + 1,local_c0);
        lVar25 = *plVar11;
        pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                             (in_RDI + 0xbf),(long)local_9c);
        local_b0 = (double)-lVar25 / ((double)*pvVar12 + 1.0);
        local_c8 = 100;
        in_stack_ffffffffffffff34 = local_a0 + local_a4;
        piVar13 = std::min<int>(&local_c8,(int *)&stack0xffffffffffffff34);
        local_c4 = -*piVar13;
        in_stack_ffffffffffffff30 =
             HighsRandom::integer
                       ((HighsRandom *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10)
                       );
        std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>::
        emplace_back<double,int,int,int&>
                  ((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                   (double *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                   (int *)in_stack_fffffffffffffc20._M_current,
                   (int *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18),
                   (int *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
      }
    }
  }
  bVar3 = std::
          vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
          ::empty((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                   *)in_stack_fffffffffffffc20._M_current);
  HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  if (!bVar3) {
    mipsolver = std::
                vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                ::begin((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                         *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    iVar14 = std::
             vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
             ::end((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    end._M_current._4_4_ = in_stack_fffffffffffffc1c;
    end._M_current._0_4_ = in_stack_fffffffffffffc18;
    pdqsort<__gnu_cxx::__normal_iterator<std::tuple<long,int,int,int>*,std::vector<std::tuple<long,int,int,int>,std::allocator<std::tuple<long,int,int,int>>>>>
              (in_stack_fffffffffffffc20,end);
    local_e8 = 0;
    while( true ) {
      pvVar15 = HighsDomain::getChangedCols((HighsDomain *)local_48);
      sVar16 = std::vector<int,_std::allocator<int>_>::size(pvVar15);
      if (sVar16 == local_e8) break;
      pvVar15 = HighsDomain::getChangedCols((HighsDomain *)local_48);
      sVar16 = local_e8 + 1;
      std::vector<int,_std::allocator<int>_>::operator[](pvVar15,local_e8);
      bVar3 = HighsDomain::isFixed
                        ((HighsDomain *)in_stack_fffffffffffffc20._M_current,
                         in_stack_fffffffffffffc1c);
      local_e8 = sVar16;
      if (bVar3) {
        *(int *)(in_RDI + 0xc3) = (int)in_RDI[0xc3] + 1;
      }
    }
    HVar5 = HighsCliqueTable::numCliques
                      ((HighsCliqueTable *)
                       CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    HVar6 = HighsImplications::getNumImplications(local_58);
    iVar28 = (int)in_RDI[0xc3];
    lVar25 = in_RDI[0xc3];
    sVar16 = std::vector<HighsSubstitution,_std::allocator<HighsSubstitution>_>::size
                       (&local_58->substitutions);
    this_00 = HighsCliqueTable::getSubstitutions(local_50);
    sVar17 = std::
             vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
             ::size(this_00);
    local_f8 = ((int)lVar25 - iVar28) + (int)sVar16 + (int)sVar17;
    lVar25 = local_50->numNeighbourhoodQueries;
    numNonzeros((HPresolve *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    piVar13 = std::max<int>((int *)&stack0xfffffffffffffefc,(int *)&stack0xfffffffffffffef8);
    lVar25 = lVar25 + *piVar13;
    local_10c = 0;
    local_130[1] = 100000;
    local_130[0] = (long)*(int *)(*in_RDI + 4) * 10;
    puVar18 = std::max<unsigned_long>(local_130 + 1,local_130);
    local_130[2] = *puVar18;
    if ((*(int *)(*(long *)(in_RDI[3] + 8) + 0x37c) != -1) &&
       (bVar3 = runProbing::anon_class_8_1_8991fb9c::operator()
                          ((anon_class_8_1_8991fb9c *)
                           CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                           CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28)), bVar3)) {
      std::function<void(int,int,int,double)>::operator=
                ((function<void_(int,_int,_int,_double)> *)
                 CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 (anon_class_16_2_2d2d8d22 *)
                 CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    }
    std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
    ::begin((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
             *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    local_160 = (tuple<long,_int,_int,_int> *)
                std::
                vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                ::end((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
                       *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      uVar30 = (undefined1)((ulong)iVar14._M_current >> 0x38);
      if (!bVar3) break;
      local_168 = __gnu_cxx::
                  __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                  ::operator*((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                               *)&stack0xfffffffffffffea8);
      p_Var19 = std::get<3ul,long,int,int,int>((tuple<long,_int,_int,_int> *)0x6f8dca);
      local_16c = *p_Var19;
      this_01 = (HighsImplications *)
                HighsCliqueTable::getSubstitution
                          ((HighsCliqueTable *)in_stack_fffffffffffffc20._M_current,
                           in_stack_fffffffffffffc1c);
      if (this_01 == (HighsImplications *)0x0) {
        bVar3 = HighsDomain::isBinary
                          ((HighsDomain *)
                           CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                           in_stack_fffffffffffffc0c);
        in_stack_fffffffffffffd04 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd04);
        if (bVar3) {
          local_174[1] = 1000;
          local_174[0] = (((int *)*in_RDI)[1] + *(int *)*in_RDI) / 0x14;
          piVar13 = std::max<int>(local_174 + 1,local_174);
          uVar30 = (undefined1)((ulong)iVar14._M_current >> 0x38);
          *(bool *)(in_RDI + 0xc6) = *piVar13 < local_f8;
          if ((*(byte *)(in_RDI + 0xc6) & 1) != 0) break;
          bVar4 = HighsCliqueTable::isFull(local_50);
          bVar3 = true;
          if (!bVar4) {
            in_stack_fffffffffffffcec =
                 HighsCliqueTable::numCliques
                           ((HighsCliqueTable *)
                            CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
            in_stack_fffffffffffffce4 = in_stack_fffffffffffffcec - HVar5;
            local_178 = 1000000;
            in_stack_fffffffffffffce8 =
                 numNonzeros((HPresolve *)
                             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
            local_184[2] = in_stack_fffffffffffffce8 * 2;
            piVar20 = std::max<int>(&local_178,local_184 + 2);
            bVar3 = true;
            if (in_stack_fffffffffffffce4 <= *piVar20) {
              HVar7 = HighsImplications::getNumImplications(local_58);
              local_184[1] = 1000000;
              HVar8 = numNonzeros((HPresolve *)
                                  CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
              local_184[0] = HVar8 * 2;
              piVar20 = std::max<int>(local_184 + 1,local_184);
              bVar3 = *piVar20 < HVar7 - HVar6;
            }
          }
          uVar30 = (undefined1)((ulong)iVar14._M_current >> 0x38);
          if (((bVar3) || (lVar25 < local_50->numNeighbourhoodQueries)) ||
             (in_RDI[0xc2] - (long)*(int *)((long)in_RDI + 0x61c) < 0)) break;
          local_188 = 0;
          HVar7 = HighsCliqueTable::numCliques
                            ((HighsCliqueTable *)
                             CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
          local_18c = -HVar7;
          local_18d = HighsImplications::runProbing(this_01,in_stack_fffffffffffffd04,piVar13);
          if ((bool)local_18d) {
            in_RDI[0xc2] = in_RDI[0xc2] + (long)local_188;
            in_stack_fffffffffffffcb4 =
                 HighsCliqueTable::numCliques
                           ((HighsCliqueTable *)
                            CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
            local_18c = local_18c + in_stack_fffffffffffffcb4;
            local_194 = 0;
            in_stack_fffffffffffffca8 = std::max<int>(&local_18c,&local_194);
            local_18c = *in_stack_fffffffffffffca8;
            while( true ) {
              in_stack_fffffffffffffca0 = HighsDomain::getChangedCols((HighsDomain *)local_48);
              sVar16 = std::vector<int,_std::allocator<int>_>::size(in_stack_fffffffffffffca0);
              if (sVar16 == local_e8) break;
              in_stack_fffffffffffffc90 = local_48;
              in_stack_fffffffffffffc98 =
                   (HPresolve *)HighsDomain::getChangedCols((HighsDomain *)local_48);
              sVar16 = local_e8 + 1;
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc98,local_e8);
              bVar3 = HighsDomain::isFixed
                                ((HighsDomain *)in_stack_fffffffffffffc20._M_current,
                                 in_stack_fffffffffffffc1c);
              in_stack_fffffffffffffc8c = CONCAT13(bVar3,(int3)in_stack_fffffffffffffc8c);
              local_e8 = sVar16;
              if (bVar3) {
                *(int *)(in_RDI + 0xc3) = (int)in_RDI[0xc3] + 1;
              }
            }
            in_stack_fffffffffffffc70 = (HPresolve *)(long)((int)in_RDI[0xc3] - iVar28);
            sVar16 = std::vector<HighsSubstitution,_std::allocator<HighsSubstitution>_>::size
                               (&local_58->substitutions);
            in_stack_fffffffffffffc78 = (double)((long)&in_stack_fffffffffffffc70->model + sVar16);
            in_stack_fffffffffffffc80 = HighsCliqueTable::getSubstitutions(local_50);
            sVar16 = std::
                     vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                     ::size(in_stack_fffffffffffffc80);
            local_198 = SUB84(in_stack_fffffffffffffc78,0) + (int)sVar16;
            if (local_f8 < local_198) {
              in_RDI[0xc2] = (long)local_f8 + in_RDI[0xc2];
              if ((*(byte *)(in_RDI[3] + 0xb0) & 1) == 0) {
                lVar25 = (long)(local_18c * 1000) + (local_198 + iVar28) * 100 + lVar25;
              }
              local_10c = 0;
              local_f8 = local_198;
            }
            else {
              if (((*(byte *)(in_RDI[3] + 0xb0) & 1) == 0) && (local_18c != 0)) {
                lVar21 = (long)(local_18c * 1000);
                local_10c = 0;
              }
              else {
                lVar21 = -(long)(local_10c * 100);
                local_10c = local_10c + 1;
              }
              lVar25 = lVar25 + lVar21;
            }
            *(int *)((long)in_RDI + 0x61c) = *(int *)((long)in_RDI + 0x61c) + 1;
            pvVar12 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                                 (in_RDI + 0xbf),(long)local_16c);
            *pvVar12 = *pvVar12 + 1;
            if (local_130[2] == 0) {
              std::function<void_(int,_int,_int,_double)>::operator=
                        ((function<void_(int,_int,_int,_double)> *)
                         CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                         (nullptr_t)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            }
            bVar3 = HighsDomain::infeasible((HighsDomain *)local_48);
            if (bVar3) {
              HighsMipAnalysis::mipTimerStop
                        ((HighsMipAnalysis *)in_stack_fffffffffffffc50,
                         (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
              local_4 = kPrimalInfeasible;
              goto LAB_006f9b9d;
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
      ::operator++((__normal_iterator<std::tuple<long,_int,_int,_int>_*,_std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>_>
                    *)&stack0xfffffffffffffea8);
    }
    HighsCliqueTable::cleanupFixed
              ((HighsCliqueTable *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
               (HighsDomain *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
    if ((local_59 & 1) == 0) {
      HighsCliqueTable::extractCliques
                ((HighsCliqueTable *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (HighsMipSolver *)mipsolver._M_current,(bool)uVar30);
    }
    HighsCliqueTable::runCliqueMerging((HighsCliqueTable *)in_stack_00000110,in_stack_00000108);
    local_1a8 = HighsCliqueTable::getDeletedRows(local_50);
    local_1b0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    local_1b8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                 ((vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)), bVar3)
    {
      piVar22 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator*(&local_1b0);
      local_1bc = *piVar22;
      pvVar24 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                           (long)local_1bc);
      if (*pvVar24 == '\0') {
        removeRow((HPresolve *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                  in_stack_fffffffffffffc2c);
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1b0);
    }
    HighsCliqueTable::getDeletedRows(local_50);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6f95bc);
    in_stack_fffffffffffffc50 = (HPresolve *)HighsCliqueTable::getCliqueExtensions(local_50);
    local_1c8 = in_stack_fffffffffffffc50;
    sVar16 = std::
             vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
             ::size((vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                     *)in_stack_fffffffffffffc50);
    local_1cc = (int)sVar16;
    local_1d8 = local_1c8;
    local_1e0._M_current =
         (pair<int,_HighsCliqueTable::CliqueVar> *)
         std::
         vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
         ::begin((vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
                  *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    std::
    vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
    ::end((vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
           *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    while (bVar3 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::pair<int,_HighsCliqueTable::CliqueVar>_*,_std::vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                              (__normal_iterator<std::pair<int,_HighsCliqueTable::CliqueVar>_*,_std::vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08)),
          bVar3) {
      ppVar23 = __gnu_cxx::
                __normal_iterator<std::pair<int,_HighsCliqueTable::CliqueVar>_*,_std::vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>_>
                ::operator*(&local_1e0);
      pvVar24 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xb9),
                           (long)ppVar23->first);
      if (*pvVar24 == '\0') {
        if (-1 < (int)ppVar23->second) {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),
                               (long)ppVar23->first);
          *pvVar10 = *pvVar10 - 1.0;
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),
                               (long)ppVar23->first);
          *pvVar10 = *pvVar10 - 1.0;
        }
        addToMatrix(in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88,
                    (double)in_stack_fffffffffffffc80);
      }
      else {
        local_1cc = local_1cc + -1;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<int,_HighsCliqueTable::CliqueVar>_*,_std::vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>_>
      ::operator++(&local_1e0);
    }
    std::
    vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
    ::clear((vector<std::pair<int,_HighsCliqueTable::CliqueVar>,_std::allocator<std::pair<int,_HighsCliqueTable::CliqueVar>_>_>
             *)0x6f9784);
    for (local_1fc = 0; HVar5 = (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20),
        local_1fc != *(int *)*in_RDI; local_1fc = local_1fc + 1) {
      pvVar24 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0xbc),
                           (long)local_1fc);
      if (*pvVar24 == '\0') {
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),
                             (long)local_1fc);
        in_stack_fffffffffffffc48 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &(local_48->impliedRowBounds).numInfSumUpperOrig.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,(long)local_1fc);
        if (in_stack_fffffffffffffc48 < *pvVar10) {
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)
                     &(local_48->impliedRowBounds).numInfSumUpperOrig.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_end_of_storage,(long)local_1fc);
          changeColLower((HPresolve *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                         (double)in_stack_fffffffffffffca0);
        }
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),
                             (long)local_1fc);
        vVar29 = *pvVar10;
        pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &(local_48->impliedRowBounds).sumLower.
                              super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_1fc);
        if (*pvVar10 <= vVar29 && vVar29 != *pvVar10) {
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)
                     &(local_48->impliedRowBounds).sumLower.
                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(long)local_1fc);
          changeColUpper((HPresolve *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                         (HighsInt)((ulong)in_stack_fffffffffffffca8 >> 0x20),
                         (double)in_stack_fffffffffffffca0);
        }
        bVar3 = HighsDomain::isFixed
                          ((HighsDomain *)in_stack_fffffffffffffc20._M_current,
                           in_stack_fffffffffffffc1c);
        if (bVar3) {
          in_stack_fffffffffffffc20._M_current = (tuple<long,_int,_int,_int> *)in_RSI;
          std::vector<double,_std::allocator<double>_>::operator[]
                    ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_1fc);
          HighsPostsolveStack::removedFixedCol<HighsEmptySlice>
                    ((HighsPostsolveStack *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c,
                     (double)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                     (HighsMatrixSlice<HighsEmptySlice> *)in_stack_fffffffffffffc70);
          removeFixedCol(in_stack_fffffffffffffc50,
                         (HighsInt)((ulong)in_stack_fffffffffffffc48 >> 0x20));
        }
        local_4 = checkLimits(in_stack_fffffffffffffc98,
                              (HighsPostsolveStack *)in_stack_fffffffffffffc90);
        if (local_4 != kOk) goto LAB_006f9b9d;
        in_stack_fffffffffffffc1c = 0;
      }
    }
    local_4 = applyConflictGraphSubstitutions
                        ((HPresolve *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
                         (HighsPostsolveStack *)
                         CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
    if (local_4 != kOk) goto LAB_006f9b9d;
    iVar28 = local_1cc;
    highsLogDev((HighsLogOptions *)(in_RDI[1] + 0x380),kInfo,
                "%d probing evaluations: %d deleted rows, %d deleted columns, %d lifted nonzeros\n",
                (ulong)(uint)(*(int *)((long)in_RDI + 0x61c) - local_3c),
                (ulong)*(uint *)(in_RDI + 0xc4),(ulong)*(uint *)((long)in_RDI + 0x624));
    if (*(int *)(*(long *)(in_RDI[3] + 8) + 0x37c) != -1) {
      if ((((int)in_RDI[0xc4] == 0) && (*(int *)((long)in_RDI + 0x624) == 0)) && (local_1cc == 0)) {
        local_4 = liftingForProbing((HPresolve *)CONCAT44(iVar31,in_stack_ffffffffffffffd8),
                                    in_stack_ffffffffffffffd0);
        if (local_4 != kOk) goto LAB_006f9b9d;
        in_stack_fffffffffffffc14 = 0;
      }
      std::
      unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
      ::clear((unordered_map<int,_HighsHashTree<std::pair<int,_int>,_double>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_HighsHashTree<std::pair<int,_int>,_double>_>_>_>
               *)0x6f9b33);
      std::function<void_(int,_int,_int,_double)>::operator=
                ((function<void_(int,_int,_int,_double)> *)
                 CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10),
                 (nullptr_t)CONCAT44(in_stack_fffffffffffffc0c,iVar28));
    }
  }
  HighsMipAnalysis::mipTimerStop((HighsMipAnalysis *)in_stack_fffffffffffffc50,HVar5);
  local_4 = checkLimits(in_stack_fffffffffffffc98,(HighsPostsolveStack *)in_stack_fffffffffffffc90);
LAB_006f9b9d:
  local_19c = 1;
  std::vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>::
  ~vector((vector<std::tuple<long,_int,_int,_int>,_std::allocator<std::tuple<long,_int,_int,_int>_>_>
           *)in_stack_fffffffffffffc20._M_current);
  return local_4;
}

Assistant:

HPresolve::Result HPresolve::runProbing(HighsPostsolveStack& postsolve_stack) {
  mipsolver->analysis_.mipTimerStart(kMipClockProbingPresolve);
  probingEarlyAbort = false;
  if (numDeletedCols + numDeletedRows != 0) shrinkProblem(postsolve_stack);

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);
  okFromCSC(model->a_matrix_.value_, model->a_matrix_.index_,
            model->a_matrix_.start_);

  mipsolver->mipdata_->cliquetable.setMaxEntries(numNonzeros());

  // first tighten all bounds if they have an implied bound that is tighter
  // than their column bound before probing this is not done for continuous
  // columns since it may allow stronger dual presolve and more aggregations
  double hugeBound = primal_feastol / kHighsTiny;
  for (HighsInt i = 0; i != model->num_col_; ++i) {
    if (model->col_lower_[i] >= implColLower[i] &&
        model->col_upper_[i] <= implColUpper[i])
      continue;

    if (std::abs(implColLower[i]) <= hugeBound) {
      double newLb = implColLower[i];
      if (newLb > model->col_lower_[i]) changeColLower(i, newLb);
    }

    if (std::abs(implColUpper[i]) <= hugeBound) {
      double newUb = implColUpper[i];
      if (newUb < model->col_upper_[i]) changeColUpper(i, newUb);
    }
  }

  HighsInt oldNumProbed = numProbed;

  mipsolver->mipdata_->setupDomainPropagation();
  HighsDomain& domain = mipsolver->mipdata_->domain;

  domain.propagate();
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }
  HighsCliqueTable& cliquetable = mipsolver->mipdata_->cliquetable;
  HighsImplications& implications = mipsolver->mipdata_->implications;
  bool firstCall = !mipsolver->mipdata_->cliquesExtracted;
  mipsolver->mipdata_->cliquesExtracted = true;

  // extract cliques that are part of the formulation every time before probing
  // after the first call we only add cliques that directly correspond to set
  // packing constraints so that the clique merging step can extend/delete them
  if (firstCall) {
    cliquetable.extractCliques(*mipsolver);
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }

    // during presolve we keep the objective upper bound without the current
    // offset so we need to update it

    if (mipsolver->mipdata_->upper_limit != kHighsInf) {
      double tmpLimit = mipsolver->mipdata_->upper_limit;
      mipsolver->mipdata_->upper_limit = tmpLimit - model->offset_;
      cliquetable.extractObjCliques(*mipsolver);
      mipsolver->mipdata_->upper_limit = tmpLimit;

      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    domain.propagate();
    if (domain.infeasible()) {
      mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
      return Result::kPrimalInfeasible;
    }
  }

  cliquetable.cleanupFixed(domain);
  if (domain.infeasible()) {
    mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
    return Result::kPrimalInfeasible;
  }

  // store binary variables in vector with their number of implications on
  // other binaries
  std::vector<std::tuple<int64_t, HighsInt, HighsInt, HighsInt>> binaries;

  if (!mipsolver->mipdata_->cliquetable.isFull()) {
    binaries.reserve(model->num_col_);
    HighsRandom random(options->random_seed);
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (domain.isBinary(i)) {
        HighsInt implicsUp = cliquetable.getNumImplications(i, 1);
        HighsInt implicsDown = cliquetable.getNumImplications(i, 0);
        binaries.emplace_back(
            -std::min(int64_t{5000}, int64_t(implicsUp) * implicsDown) /
                (1.0 + numProbes[i]),
            -std::min(HighsInt{100}, implicsUp + implicsDown), random.integer(),
            i);
      }
    }
  }
  if (!binaries.empty()) {
    // sort variables with many implications on other binaries first
    pdqsort(binaries.begin(), binaries.end());

    size_t numChangedCols = 0;
    while (domain.getChangedCols().size() != numChangedCols) {
      if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
        ++probingNumDelCol;
    }

    HighsInt numCliquesStart = cliquetable.numCliques();
    HighsInt numImplicsStart = implications.getNumImplications();
    HighsInt numDelStart = probingNumDelCol;

    HighsInt numDel = probingNumDelCol - numDelStart +
                      implications.substitutions.size() +
                      cliquetable.getSubstitutions().size();
    int64_t splayContingent =
        cliquetable.numNeighbourhoodQueries +
        std::max(mipsolver->submip ? HighsInt{0} : HighsInt{100000},
                 10 * numNonzeros());
    HighsInt numFail = 0;

    // lambda to check if model has enough continuous variables to perform
    // lifting for probing
    auto modelHasPercentageContVars = [&](size_t percentage) {
      size_t num_cols = 0, num_cont_cols = 0;
      for (size_t col = 0; col < colsize.size(); col++) {
        if (colDeleted[col]) continue;
        num_cols++;
        if (model->integrality_[col] == HighsVarType::kContinuous)
          num_cont_cols++;
      }
      return size_t{100} * num_cont_cols >= percentage * num_cols;
    };

    // collect up to 10 lifting opportunities per row
    const size_t maxNumLiftOpps = std::max(
        size_t{100000}, size_t{10} * static_cast<size_t>(model->num_row_));

    // only search for lifting opportunities if at least 2 percent of the
    // variables in the problem are continuous
    size_t numLiftOpps = 0;
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1 &&
        modelHasPercentageContVars(size_t{2})) {
      // store lifting opportunities
      implications.storeLiftingOpportunity = [&](HighsInt row, HighsInt col,
                                                 HighsInt val, double coef) {
        // find lifting opportunities for row
        auto& htree = liftingOpportunities[row];
        // add element
        auto insertresult = htree.insert_or_get(std::make_pair(col, val), coef);
        assert(insertresult.second);
        numLiftOpps++;
      };
    }

    for (const auto& binvar : binaries) {
      HighsInt i = std::get<3>(binvar);

      if (cliquetable.getSubstitution(i) != nullptr || !domain.isBinary(i))
        continue;

      // when a large percentage of columns have been deleted, stop this round
      // of probing
      // if (numDel > std::max(model->num_col_ * 0.2, 1000.)) break;
      probingEarlyAbort =
          numDel >
          std::max(HighsInt{1000}, (model->num_row_ + model->num_col_) / 20);
      if (probingEarlyAbort) break;

      // break in case of too many new implications to not spent ages in
      // probing
      if (cliquetable.isFull() ||
          cliquetable.numCliques() - numCliquesStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()) ||
          implications.getNumImplications() - numImplicsStart >
              std::max(HighsInt{1000000}, 2 * numNonzeros()))
        break;

      // if (numProbed % 10 == 0)
      //   printf(
      //       "numprobed=%d  numDel=%d  newcliques=%d "
      //       "numNeighbourhoodQueries=%ld  "
      //       "splayContingent=%ld\n",
      //       numProbed, numDel, cliquetable.numCliques() - numCliquesStart,
      //       cliquetable.numNeighbourhoodQueries, splayContingent);
      if (cliquetable.numNeighbourhoodQueries > splayContingent) break;

      if (probingContingent - numProbed < 0) break;

      HighsInt numBoundChgs = 0;
      HighsInt numNewCliques = -cliquetable.numCliques();
      const bool probing_result = implications.runProbing(i, numBoundChgs);
      if (!probing_result) continue;
      probingContingent += numBoundChgs;
      numNewCliques += cliquetable.numCliques();
      numNewCliques = std::max(numNewCliques, HighsInt{0});
      while (domain.getChangedCols().size() != numChangedCols) {
        if (domain.isFixed(domain.getChangedCols()[numChangedCols++]))
          ++probingNumDelCol;
      }
      HighsInt newNumDel = probingNumDelCol - numDelStart +
                           implications.substitutions.size() +
                           cliquetable.getSubstitutions().size();

      if (newNumDel > numDel) {
        probingContingent += numDel;
        if (!mipsolver->submip) {
          splayContingent += 100 * (newNumDel + numDelStart);
          splayContingent += 1000 * numNewCliques;
        }
        numDel = newNumDel;
        numFail = 0;
      } else if (mipsolver->submip || numNewCliques == 0) {
        splayContingent -= 100 * numFail;
        ++numFail;
      } else {
        splayContingent += 1000 * numNewCliques;
        numFail = 0;
      }

      ++numProbed;
      numProbes[i] += 1;

      // Stop collecting lifting opportunities if maximum is reached
      if (numLiftOpps >= maxNumLiftOpps)
        implications.storeLiftingOpportunity = nullptr;

      // printf("nprobed: %" HIGHSINT_FORMAT ", numCliques: %" HIGHSINT_FORMAT
      // "\n", nprobed,
      //       cliquetable.numCliques());
      if (domain.infeasible()) {
        mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
        return Result::kPrimalInfeasible;
      }
    }

    cliquetable.cleanupFixed(domain);

    if (!firstCall) cliquetable.extractCliques(*mipsolver, false);
    cliquetable.runCliqueMerging(domain);

    // apply changes from probing

    // first delete redundant clique inequalities
    for (HighsInt delrow : cliquetable.getDeletedRows())
      if (!rowDeleted[delrow]) removeRow(delrow);
    cliquetable.getDeletedRows().clear();

    // add nonzeros from clique lifting before removing fixed variables, since
    // this might lead to stronger constraint sides
    auto& extensionvars = cliquetable.getCliqueExtensions();
    HighsInt addednnz = extensionvars.size();
    for (const auto& cliqueextension : extensionvars) {
      if (rowDeleted[cliqueextension.first]) {
        --addednnz;
        continue;
      }
      double val;
      if (cliqueextension.second.val == 0) {
        model->row_lower_[cliqueextension.first] -= 1;
        model->row_upper_[cliqueextension.first] -= 1;
        val = -1.0;
      } else
        val = 1.0;
      addToMatrix(cliqueextension.first, cliqueextension.second.col, val);
    }
    extensionvars.clear();

    // now remove fixed columns and tighten domains
    for (HighsInt i = 0; i != model->num_col_; ++i) {
      if (colDeleted[i]) continue;
      if (model->col_lower_[i] < domain.col_lower_[i])
        changeColLower(i, domain.col_lower_[i]);
      if (model->col_upper_[i] > domain.col_upper_[i])
        changeColUpper(i, domain.col_upper_[i]);
      if (domain.isFixed(i)) {
        postsolve_stack.removedFixedCol(i, model->col_lower_[i], 0.0,
                                        HighsEmptySlice());
        removeFixedCol(i);
      }
      HPRESOLVE_CHECKED_CALL(checkLimits(postsolve_stack));
    }

    // finally apply substitutions
    HPRESOLVE_CHECKED_CALL(applyConflictGraphSubstitutions(postsolve_stack));

    highsLogDev(options->log_options, HighsLogType::kInfo,
                "%" HIGHSINT_FORMAT " probing evaluations: %" HIGHSINT_FORMAT
                " deleted rows, %" HIGHSINT_FORMAT
                " deleted "
                "columns, %" HIGHSINT_FORMAT " lifted nonzeros\n",
                numProbed - oldNumProbed, numDeletedRows, numDeletedCols,
                addednnz);

    // lifting for probing
    if (mipsolver->options_mip_->mip_lifting_for_probing != -1) {
      // only perform lifting if probing did not modify the problem so far
      if (numDeletedRows == 0 && numDeletedCols == 0 && addednnz == 0)
        HPRESOLVE_CHECKED_CALL(liftingForProbing(postsolve_stack));
      // clear lifting opportunities
      liftingOpportunities.clear();
      implications.storeLiftingOpportunity = nullptr;
    }
  }

  mipsolver->analysis_.mipTimerStop(kMipClockProbingPresolve);
  return checkLimits(postsolve_stack);
}